

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_new_dummy(lyd_node *root,lyd_node *parent,lys_node *schema,char *value,int dflt)

{
  LYS_NODE LVar1;
  int iVar2;
  ly_set *set;
  LY_ERR *pLVar3;
  bool bVar4;
  lyd_node *local_58;
  lyd_node *dummy;
  lyd_node *iter;
  lys_node *siter;
  ly_set *spath;
  uint index;
  int dflt_local;
  char *value_local;
  lys_node *schema_local;
  lyd_node *parent_local;
  lyd_node *root_local;
  
  local_58 = (lyd_node *)0x0;
  if (schema == (lys_node *)0x0) {
    __assert_fail("schema",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x5ff,
                  "struct lyd_node *lyd_new_dummy(struct lyd_node *, struct lyd_node *, const struct lys_node *, const char *, int)"
                 );
  }
  if ((schema->nodetype & 0xc1bd) == LYS_UNKNOWN) {
    __assert_fail("schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x601,
                  "struct lyd_node *lyd_new_dummy(struct lyd_node *, struct lyd_node *, const struct lys_node *, const char *, int)"
                 );
  }
  set = ly_set_new();
  if (set == (ly_set *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_new_dummy");
    root_local = (lyd_node *)0x0;
  }
  else {
    iter = (lyd_node *)schema;
    parent_local = root;
    if ((parent == (lyd_node *)0x0) && (root != (lyd_node *)0x0)) {
      for (; parent_local->parent != (lyd_node *)0x0; parent_local = parent_local->parent) {
      }
      while (parent_local->prev->next != (lyd_node *)0x0) {
        parent_local = parent_local->prev;
      }
    }
    for (; (iter != (lyd_node *)0x0 &&
           ((parent == (lyd_node *)0x0 || (parent->schema != (lys_node *)iter))));
        iter = (lyd_node *)lys_parent((lys_node *)iter)) {
      if (((ulong)iter[1].schema & 0xc1bd) != 0) {
        ly_set_add(set,iter,1);
      }
    }
    if (set->number == 0) {
      __assert_fail("spath->number > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                    ,0x61d,
                    "struct lyd_node *lyd_new_dummy(struct lyd_node *, struct lyd_node *, const struct lys_node *, const char *, int)"
                   );
    }
    spath._0_4_ = set->number;
    schema_local = (lys_node *)parent;
    if ((parent == (lyd_node *)0x0) &&
       (((set->set).s[(uint)spath - 1]->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN)) {
      for (dummy = parent_local; dummy != (lyd_node *)0x0; dummy = dummy->next) {
        if (dummy->schema == (set->set).s[(uint)spath - 1]) {
          schema_local = (lys_node *)dummy;
          spath._0_4_ = (uint)spath - 1;
          break;
        }
      }
    }
    dummy = (lyd_node *)schema_local;
LAB_00188948:
    bVar4 = false;
    if ((dummy != (lyd_node *)0x0) && (bVar4 = false, (uint)spath != 0)) {
      bVar4 = ((set->set).s[(uint)spath - 1]->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN;
    }
    if (bVar4) {
      for (dummy = (lyd_node *)schema_local->module; dummy != (lyd_node *)0x0; dummy = dummy->next)
      {
        if (dummy->schema == (set->set).s[(uint)spath - 1]) {
          spath._0_4_ = (uint)spath - 1;
          schema_local = (lys_node *)dummy;
          break;
        }
      }
      goto LAB_00188948;
    }
    for (; (uint)spath != 0; spath._0_4_ = (uint)spath - 1) {
      LVar1 = (set->set).s[(uint)spath - 1]->nodetype;
      if (LVar1 == LYS_CONTAINER) {
LAB_00188adf:
        dummy = _lyd_new((lyd_node *)schema_local,(set->set).s[(uint)spath - 1],dflt);
      }
      else if ((LVar1 == LYS_LEAF) || (LVar1 == LYS_LEAFLIST)) {
        if (value == (char *)0x0) {
          dummy = lyd_create_leaf((set->set).s[(uint)spath - 1],(char *)0x0,dflt);
          if (((dummy != (lyd_node *)0x0) && (schema_local != (lys_node *)0x0)) &&
             (iVar2 = lyd_insert((lyd_node *)schema_local,dummy), iVar2 != 0)) {
            lyd_free(dummy);
            goto LAB_00188ba3;
          }
        }
        else {
          dummy = _lyd_new_leaf((lyd_node *)schema_local,(set->set).s[(uint)spath - 1],value,dflt);
        }
      }
      else {
        if (LVar1 == LYS_LIST) goto LAB_00188adf;
        if ((LVar1 != LYS_ANYXML) && (LVar1 != LYS_ANYDATA)) goto LAB_00188ba3;
        dummy = lyd_create_anydata((lyd_node *)schema_local,(set->set).s[(uint)spath - 1],"",
                                   LYD_ANYDATA_CONSTSTRING);
      }
      if (dummy == (lyd_node *)0x0) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
               ,0x652);
LAB_00188ba3:
        ly_set_free(set);
        lyd_free(local_58);
        return (lyd_node *)0x0;
      }
      dummy->validity = 0x80;
      if (local_58 == (lyd_node *)0x0) {
        local_58 = dummy;
      }
      schema_local = (lys_node *)dummy;
    }
    ly_set_free(set);
    root_local = local_58;
  }
  return root_local;
}

Assistant:

struct lyd_node *
lyd_new_dummy(struct lyd_node *root, struct lyd_node *parent, const struct lys_node *schema, const char *value, int dflt)
{
    unsigned int index;
    struct ly_set *spath;
    const struct lys_node *siter;
    struct lyd_node *iter, *dummy = NULL;

    assert(schema);
    assert(schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF |
                               LYS_RPC | LYS_ACTION));

    spath = ly_set_new();
    if (!spath) {
        LOGMEM;
        return NULL;
    }

    if (!parent && root) {
        /* find data root */
        for (; root->parent; root = root->parent);   /* vertical move (up) */
        for (; root->prev->next; root = root->prev); /* horizontal move (left) */
    }

    /* build schema path */
    for (siter = schema; siter; siter = lys_parent(siter)) {
        /* stop if we know some of the parents */
        if (parent && parent->schema == siter) {
            break;
        }

        if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF |
                               LYS_RPC | LYS_ACTION)) {
            /* we have a node that can appear in data tree */
            ly_set_add(spath, (void*)siter, LY_SET_OPT_USEASLIST);
        } /* else skip the rest node types */
    }

    assert(spath->number > 0);
    index = spath->number;
    if (!parent && !(spath->set.s[index - 1]->nodetype & LYS_LEAFLIST)) {
        /* start by searching for the top-level parent */
        LY_TREE_FOR(root, iter) {
            if (iter->schema == spath->set.s[index - 1]) {
                parent = iter;
                index--;
                break;
            }
        }
    }

    iter = parent;
    while (iter && index && !(spath->set.s[index - 1]->nodetype & LYS_LEAFLIST)) {
        /* search for closer parent on the path */
        LY_TREE_FOR(parent->child, iter) {
            if (iter->schema == spath->set.s[index - 1]) {
                index--;
                parent = iter;
                break;
            }
        }
    }
    while(index) {
        /* create the missing part of the path */
        switch (spath->set.s[index - 1]->nodetype) {
        case LYS_LEAF:
        case LYS_LEAFLIST:
            if (value) {
                iter = _lyd_new_leaf(parent, spath->set.s[index - 1], value, dflt);
            } else {
                iter = lyd_create_leaf(spath->set.s[index - 1], value, dflt);
                if (iter && parent) {
                    if (lyd_insert(parent, iter)) {
                        lyd_free(iter);
                        goto error;
                    }
                }
            }
            break;
        case LYS_CONTAINER:
        case LYS_LIST:
            iter = _lyd_new(parent, spath->set.s[index - 1], dflt);
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            iter = lyd_create_anydata(parent, spath->set.s[index - 1], "", LYD_ANYDATA_CONSTSTRING);
            break;
        default:
            goto error;
        }
        if (!iter) {
            LOGINT;
            goto error;
        }

        /* we say it is valid and it is dummy */
        iter->validity = LYD_VAL_INUSE;

        if (!dummy) {
            dummy = iter;
        }

        /* continue */
        parent = iter;
        index--;
    }

    ly_set_free(spath);


    return dummy;

error:
    ly_set_free(spath);
    lyd_free(dummy);
    return NULL;
}